

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

SearchResult<int,_false> __thiscall
absl::container_internal::
btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,compare_ptr,std::allocator<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>,256,true>>
::
binary_search_impl<std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>,absl::container_internal::upper_bound_adapter<absl::container_internal::key_compare_adapter<compare_ptr,std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>::checked_compare>>
          (undefined8 param_1,undefined8 param_2,int param_3,int param_4,
          btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
          *param_5)

{
  bool bVar1;
  int iVar2;
  int mid;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
  *this;
  int local_20;
  int local_1c;
  SearchResult<int,_false> local_4;
  
  iVar2 = param_4;
  local_1c = param_3;
  while (local_20 = iVar2, local_1c != local_20) {
    iVar2 = local_1c + local_20 >> 1;
    this = param_5;
    btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
    ::key(param_5,in_stack_ffffffffffffffbc);
    bVar1 = upper_bound_adapter<absl::container_internal::key_compare_adapter<compare_ptr,std::unique_ptr<SeqEntry,std::default_delete<SeqEntry>>>::checked_compare>
            ::operator()((upper_bound_adapter<absl::container_internal::key_compare_adapter<compare_ptr,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>::checked_compare>
                          *)this,(unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_> *)
                                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                         (unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_> *)0x191947);
    if (bVar1) {
      local_1c = iVar2 + 1;
      iVar2 = local_20;
    }
  }
  SearchResult<int,_false>::SearchResult(&local_4,local_1c);
  return (SearchResult<int,_false>)local_4.value;
}

Assistant:

SearchResult<int, false> binary_search_impl(
      const K &k, int s, int e, const Compare &comp,
      std::false_type /* IsCompareTo */) const {
    while (s != e) {
      const int mid = (s + e) >> 1;
      if (comp(key(mid), k)) {
        s = mid + 1;
      } else {
        e = mid;
      }
    }
    return SearchResult<int, false>{s};
  }